

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O2

bool __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,uint64_t key,
          uint64_t val)

{
  bool bVar1;
  uint64_t uVar2;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  ulong slot_id;
  ulong uVar3;
  ulong quo;
  uint64_t local_d0;
  uint64_t empty_id;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_b0 [5];
  
  if (this->max_size_ <= this->size_) {
    compact_hash_table((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                       &empty_id,(this->univ_size_).bits_,(this->capa_size_).bits_ + 1);
    clone(this,(__fn *)&empty_id,__child_stack,in_ECX,in_R8);
    operator=(this,(compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                   &empty_id);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(local_b0);
  }
  uVar2 = bijective_hash::split_mix_hasher::hash(&this->hasher_,key);
  quo = uVar2 >> ((ulong)(byte)(this->capa_size_).bits_ & 0x3f);
  slot_id = uVar2 & (this->capa_size_).mask_;
  bVar1 = is_vacant_(this,slot_id);
  if (bVar1) {
    update_slot_(this,slot_id,quo,val,true,true);
  }
  else {
    empty_id = 0;
    uVar2 = find_ass_cbit_(this,slot_id,&empty_id);
    local_d0 = uVar2;
    bVar1 = get_vbit_(this,slot_id);
    if (bVar1) {
      bVar1 = find_item_(this,&local_d0,quo);
      if (bVar1) {
        set_val_(this,local_d0,val);
        return false;
      }
      local_d0 = local_d0 - 1 & (this->capa_size_).mask_;
      for (; empty_id != local_d0; empty_id = copy_from_right_(this,empty_id)) {
      }
      bVar1 = false;
      uVar2 = local_d0;
    }
    else {
      if (uVar2 != 0xffffffffffffffff) {
        do {
          uVar2 = uVar2 + 1 & (this->capa_size_).mask_;
          bVar1 = get_cbit_(this,uVar2);
        } while (!bVar1);
        uVar3 = uVar2 - 1 & (this->capa_size_).mask_;
        local_d0 = uVar3;
        for (; empty_id != uVar3; empty_id = copy_from_right_(this,empty_id)) {
        }
      }
      bVar1 = true;
      set_vbit_(this,slot_id,true);
      uVar2 = empty_id;
    }
    set_cbit_(this,uVar2,bVar1);
    set_quo_(this,empty_id,quo);
    set_val_(this,empty_id,val);
  }
  this->size_ = this->size_ + 1;
  return true;
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        assert(key < univ_size_.size());
        assert(val < val_mask);

        if (max_size_ <= size_) {
            // expand
            this_type new_cht{univ_size_.bits(), capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
            new_cht.num_resize_ = num_resize_ + 1;
#endif
            clone(new_cht);
            *this = std::move(new_cht);
        }

        auto [quo, mod] = decompose_(hasher_.hash(key));

        if (is_vacant_(mod)) {
            // without collision
            update_slot_(mod, quo, val, true, true);
            ++size_;
            return true;
        }

        uint64_t empty_id = 0;
        uint64_t slot_id = find_ass_cbit_(mod, empty_id);

        if (!get_vbit_(mod)) {  // initial insertion in the group
            // create a new collision group
            if (slot_id != UINT64_MAX) {  // require to displace existing groups?
                do {
                    slot_id = right_(slot_id);
                } while (!get_cbit_(slot_id));

                slot_id = left_(slot_id);  // rightmost slot of the group

                while (empty_id != slot_id) {
                    empty_id = copy_from_right_(empty_id);
                }
            } else {
                // not inside other collision groups
            }
            set_vbit_(mod, true);
            set_cbit_(empty_id, true);
        } else {
            // collision group already exists
            if (find_item_(slot_id, quo)) {  // already registered?
                set_val_(slot_id, val);  // update
                return false;
            }

            slot_id = left_(slot_id);  // rightmost of the group

            // displace existing groups for creating an empty slot
            while (empty_id != slot_id) {
                empty_id = copy_from_right_(empty_id);
            }
            set_cbit_(empty_id, false);
        }

        set_quo_(empty_id, quo);
        set_val_(empty_id, val);

        ++size_;

        return true;
    }